

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

bool __thiscall
Js::DebuggerScope::AreAllPropertiesInDeadZone(DebuggerScope *this,int byteCodeOffset)

{
  List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  
  pLVar1 = (this->scopeProperties).ptr;
  if ((pLVar1 == (List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  *)0x0) ||
     ((pLVar1->super_ReadOnlyList<Js::DebuggerScopeProperty,_Memory::Recycler,_DefaultComparer>).
      count < 1)) {
    bVar2 = false;
  }
  else {
    lVar4 = 0;
    lVar3 = 0;
    do {
      bVar2 = DebuggerScopeProperty::IsInDeadZone
                        ((DebuggerScopeProperty *)
                         ((long)&((pLVar1->
                                  super_ReadOnlyList<Js::DebuggerScopeProperty,_Memory::Recycler,_DefaultComparer>
                                  ).buffer.ptr)->propId + lVar4),byteCodeOffset);
      if (!bVar2) {
        return bVar2;
      }
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0x10;
    } while (lVar3 < (pLVar1->
                     super_ReadOnlyList<Js::DebuggerScopeProperty,_Memory::Recycler,_DefaultComparer>
                     ).count);
  }
  return bVar2;
}

Assistant:

bool DebuggerScope::AreAllPropertiesInDeadZone(int byteCodeOffset) const
    {
        if (!this->HasProperties())
        {
            return false;
        }

        return this->scopeProperties->All([&](Js::DebuggerScopeProperty& propertyItem)
            {
                return propertyItem.IsInDeadZone(byteCodeOffset);
            });
    }